

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

int json_array_extend(json_t *json,json_t *other_json)

{
  json_t **ppjVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((((json != (json_t *)0x0) && (other_json != (json_t *)0x0)) && (json->type == JSON_ARRAY)) &&
     (other_json->type == JSON_ARRAY)) {
    ppjVar1 = json_array_grow((json_array_t *)json,*(size_t *)(other_json + 4),1);
    if (ppjVar1 != (json_t **)0x0) {
      memcpy((void *)(*(long *)(json + 4) * 8 + *(long *)(json + 6)),*(void **)(other_json + 6),
             *(long *)(other_json + 4) << 3);
      *(long *)(json + 4) = *(long *)(json + 4) + *(long *)(other_json + 4);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int json_array_extend(json_t *json, json_t *other_json) {
    json_array_t *array, *other;
    size_t i;

    if (!json_is_array(json) || !json_is_array(other_json))
        return -1;
    array = json_to_array(json);
    other = json_to_array(other_json);

    if (!json_array_grow(array, other->entries, 1))
        return -1;

    for (i = 0; i < other->entries; i++)
        json_incref(other->table[i]);

    array_copy(array->table, array->entries, other->table, 0, other->entries);

    array->entries += other->entries;
    return 0;
}